

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  reference pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  undefined1 local_520 [8];
  string path_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f8;
  iterator i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined1 local_490 [8];
  string path_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  iterator i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  undefined1 local_400 [8];
  string path_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  iterator i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string path;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  iterator i;
  undefined1 local_338 [7];
  bool found;
  undefined1 local_318 [8];
  string root;
  size_type pos;
  string cxxFile;
  string local_2c8 [8];
  string message;
  string includeFile;
  size_t qend;
  size_t qstart;
  string currentline;
  undefined1 local_250 [8];
  string line;
  long local_220;
  ifstream fin;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_220,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)local_250);
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_220,(string *)local_250,(bool *)0x0,-1), bVar2) {
      currentline.field_2._8_8_ = std::__cxx11::string::c_str();
      bVar2 = cmHasLiteralPrefix<char_const*,9ul>
                        ((char **)((long)&currentline.field_2 + 8),(char (*) [9])"#include");
      if (bVar2) {
        std::__cxx11::string::string((string *)&qstart,(string *)local_250);
        lVar4 = std::__cxx11::string::find((char)&qstart,0x22);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find((char)&qstart,0x3c);
          if (lVar4 != -1) {
            std::__cxx11::string::find((char)&qstart,0x3e);
            goto LAB_007af3e4;
          }
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error("unknown include directive ",pcVar3,(char *)0x0,(char *)0x0);
          line.field_2._8_4_ = 2;
        }
        else {
          std::__cxx11::string::find((char)&qstart,0x22);
LAB_007af3e4:
          std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)&qstart);
          bVar2 = cmsys::RegularExpression::find
                            (&this->IncludeFileRegularExpression,
                             (string *)((long)&message.field_2 + 8));
          if (bVar2) {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            AddDependency(this,info,pcVar3);
            std::__cxx11::string::string
                      ((string *)&pos,(string *)(message.field_2._M_local_buf + 8));
            root.field_2._8_8_ = std::__cxx11::string::rfind((char)&pos,0x2e);
            if (root.field_2._8_8_ != -1) {
              std::__cxx11::string::substr((ulong)local_318,(ulong)&pos);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_338,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_318,".cxx");
              std::__cxx11::string::operator=((string *)&pos,(string *)local_338);
              std::__cxx11::string::~string((string *)local_338);
              i._M_current._7_1_ = 0;
              pcVar3 = (char *)std::__cxx11::string::c_str();
              bVar2 = cmsys::SystemTools::FileExists(pcVar3);
              if (bVar2) {
                i._M_current._7_1_ = 1;
              }
              local_348._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->IncludeDirectories);
              while( true ) {
                path.field_2._8_8_ =
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&this->IncludeDirectories);
                bVar2 = __gnu_cxx::operator!=
                                  (&local_348,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&path.field_2 + 8));
                if (!bVar2) break;
                pbVar5 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_348);
                std::__cxx11::string::string((string *)local_370,(string *)pbVar5);
                std::operator+(&local_390,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_370,"/");
                std::__cxx11::string::operator=((string *)local_370,(string *)&local_390);
                std::__cxx11::string::~string((string *)&local_390);
                std::operator+(&local_3b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_370,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pos);
                std::__cxx11::string::operator=((string *)local_370,(string *)&local_3b0);
                std::__cxx11::string::~string((string *)&local_3b0);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                std::__cxx11::string::~string((string *)local_370);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_348);
              }
              if ((i._M_current._7_1_ & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_318,".cpp");
                std::__cxx11::string::operator=((string *)&pos,(string *)&i_1);
                std::__cxx11::string::~string((string *)&i_1);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                local_3d8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->IncludeDirectories);
                while( true ) {
                  path_1.field_2._8_8_ =
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&this->IncludeDirectories);
                  bVar2 = __gnu_cxx::operator!=
                                    (&local_3d8,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&path_1.field_2 + 8));
                  if (!bVar2) break;
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_3d8);
                  std::__cxx11::string::string((string *)local_400,(string *)pbVar5);
                  std::operator+(&local_420,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_400,"/");
                  std::__cxx11::string::operator=((string *)local_400,(string *)&local_420);
                  std::__cxx11::string::~string((string *)&local_420);
                  std::operator+(&local_440,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_400,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
                  std::__cxx11::string::operator=((string *)local_400,(string *)&local_440);
                  std::__cxx11::string::~string((string *)&local_440);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                  if (bVar2) {
                    i._M_current._7_1_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_400);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_3d8);
                }
              }
              if ((i._M_current._7_1_ & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_318,".c");
                std::__cxx11::string::operator=((string *)&pos,(string *)&i_2);
                std::__cxx11::string::~string((string *)&i_2);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                local_468._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->IncludeDirectories);
                while( true ) {
                  path_2.field_2._8_8_ =
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&this->IncludeDirectories);
                  bVar2 = __gnu_cxx::operator!=
                                    (&local_468,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&path_2.field_2 + 8));
                  if (!bVar2) break;
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_468);
                  std::__cxx11::string::string((string *)local_490,(string *)pbVar5);
                  std::operator+(&local_4b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_490,"/");
                  std::__cxx11::string::operator=((string *)local_490,(string *)&local_4b0);
                  std::__cxx11::string::~string((string *)&local_4b0);
                  std::operator+(&local_4d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_490,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
                  std::__cxx11::string::operator=((string *)local_490,(string *)&local_4d0);
                  std::__cxx11::string::~string((string *)&local_4d0);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                  if (bVar2) {
                    i._M_current._7_1_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_490);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_468);
                }
              }
              if ((i._M_current._7_1_ & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i_3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_318,".txx");
                std::__cxx11::string::operator=((string *)&pos,(string *)&i_3);
                std::__cxx11::string::~string((string *)&i_3);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                local_4f8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->IncludeDirectories);
                while( true ) {
                  path_3.field_2._8_8_ =
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&this->IncludeDirectories);
                  bVar2 = __gnu_cxx::operator!=
                                    (&local_4f8,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&path_3.field_2 + 8));
                  if (!bVar2) break;
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_4f8);
                  std::__cxx11::string::string((string *)local_520,(string *)pbVar5);
                  std::operator+(&local_540,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_520,"/");
                  std::__cxx11::string::operator=((string *)local_520,(string *)&local_540);
                  std::__cxx11::string::~string((string *)&local_540);
                  std::operator+(&local_560,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_520,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
                  std::__cxx11::string::operator=((string *)local_520,(string *)&local_560);
                  std::__cxx11::string::~string((string *)&local_560);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                  if (bVar2) {
                    i._M_current._7_1_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_520);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_4f8);
                }
              }
              if ((i._M_current._7_1_ & 1) != 0) {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                AddDependency(this,info,pcVar3);
              }
              std::__cxx11::string::~string((string *)local_318);
            }
            std::__cxx11::string::~string((string *)&pos);
            line.field_2._8_4_ = 0;
          }
          else {
            if ((this->Verbose & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_2c8,"Skipping ",(allocator *)(cxxFile.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator
                        ((allocator<char> *)(cxxFile.field_2._M_local_buf + 0xf));
              std::__cxx11::string::operator+=
                        (local_2c8,(string *)(message.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=(local_2c8," for file ");
              pcVar3 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::string::operator+=(local_2c8,pcVar3);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string(local_2c8);
            }
            line.field_2._8_4_ = 2;
          }
          std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)&qstart);
      }
    }
    std::__cxx11::string::~string((string *)local_250);
    line.field_2._8_4_ = 0;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("error can not open ",pcVar3,(char *)0x0,(char *)0x0);
    line.field_2._8_4_ = 1;
  }
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void DependWalk(cmDependInformation* info)
  {
    cmsys::ifstream fin(info->FullPath.c_str());
    if(!fin)
      {
      cmSystemTools::Error("error can not open ", info->FullPath.c_str());
      return;
      }

    std::string line;
    while(cmSystemTools::GetLineFromStream(fin, line))
      {
      if(cmHasLiteralPrefix(line.c_str(), "#include"))
        {
        // if it is an include line then create a string class
        std::string currentline = line;
        size_t qstart = currentline.find('\"', 8);
        size_t qend;
        // if a quote is not found look for a <
        if(qstart == std::string::npos)
          {
          qstart = currentline.find('<', 8);
          // if a < is not found then move on
          if(qstart == std::string::npos)
            {
            cmSystemTools::Error("unknown include directive ",
                                 currentline.c_str() );
            continue;
            }
          else
            {
            qend = currentline.find('>', qstart+1);
            }
          }
        else
          {
          qend = currentline.find('\"', qstart+1);
          }
        // extract the file being included
        std::string includeFile =
          currentline.substr(qstart+1, qend - qstart-1);
        // see if the include matches the regular expression
        if(!this->IncludeFileRegularExpression.find(includeFile))
          {
          if(this->Verbose)
            {
            std::string message = "Skipping ";
            message += includeFile;
            message += " for file ";
            message += info->FullPath.c_str();
            cmSystemTools::Error(message.c_str(), 0);
            }
          continue;
          }

        // Add this file and all its dependencies.
        this->AddDependency(info, includeFile.c_str());
        /// add the cxx file if it exists
        std::string cxxFile = includeFile;
        std::string::size_type pos = cxxFile.rfind('.');
        if(pos != std::string::npos)
          {
          std::string root = cxxFile.substr(0, pos);
          cxxFile = root + ".cxx";
          bool found = false;
          // try jumping to .cxx .cpp and .c in order
          if(cmSystemTools::FileExists(cxxFile.c_str()))
            {
            found = true;
            }
          for(std::vector<std::string>::iterator i =
              this->IncludeDirectories.begin();
              i != this->IncludeDirectories.end(); ++i)
            {
            std::string path = *i;
            path = path + "/";
            path = path + cxxFile;
            if(cmSystemTools::FileExists(path.c_str()))
              {
              found = true;
              }
            }
          if (!found)
            {
            cxxFile = root + ".cpp";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (!found)
            {
            cxxFile = root + ".c";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (!found)
            {
            cxxFile = root + ".txx";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (found)
            {
            this->AddDependency(info, cxxFile.c_str());
            }
          }
        }
      }
  }